

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int uv_poll_init(uv_loop_t *loop,uv_poll_t *handle,int fd)

{
  int iVar1;
  int local_28;
  int err;
  int fd_local;
  uv_poll_t *handle_local;
  uv_loop_t *loop_local;
  
  iVar1 = uv__fd_exists(loop,fd);
  if (iVar1 == 0) {
    loop_local._4_4_ = uv__io_check_fd(loop,fd);
    if (loop_local._4_4_ == 0) {
      local_28 = uv__nonblock_ioctl(fd,1);
      if (local_28 == -0x19) {
        local_28 = uv__nonblock_fcntl(fd,1);
      }
      if (local_28 == 0) {
        handle->loop = loop;
        handle->type = UV_POLL;
        handle->flags = 8;
        uv__queue_insert_tail(&loop->handle_queue,&handle->handle_queue);
        handle->next_closing = (uv_handle_t *)0x0;
        uv__io_init(&handle->io_watcher,uv__poll_io,fd);
        handle->poll_cb = (uv_poll_cb)0x0;
        loop_local._4_4_ = 0;
      }
      else {
        loop_local._4_4_ = local_28;
      }
    }
  }
  else {
    loop_local._4_4_ = -0x11;
  }
  return loop_local._4_4_;
}

Assistant:

int uv_poll_init(uv_loop_t* loop, uv_poll_t* handle, int fd) {
  int err;

  if (uv__fd_exists(loop, fd))
    return UV_EEXIST;

  err = uv__io_check_fd(loop, fd);
  if (err)
    return err;

  /* If ioctl(FIONBIO) reports ENOTTY, try fcntl(F_GETFL) + fcntl(F_SETFL).
   * Workaround for e.g. kqueue fds not supporting ioctls.
   */
  err = uv__nonblock(fd, 1);
#if UV__NONBLOCK_IS_IOCTL
  if (err == UV_ENOTTY)
    err = uv__nonblock_fcntl(fd, 1);
#endif

  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*) handle, UV_POLL);
  uv__io_init(&handle->io_watcher, uv__poll_io, fd);
  handle->poll_cb = NULL;
  return 0;
}